

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O3

void __thiscall
kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>_>::AdapterImpl
          (AdapterImpl<kj::Rc<kj::Refcounted>_> *this,
          PromiseFulfiller<kj::Rc<kj::Refcounted>_> *fulfiller,Canceler *canceler,
          Promise<kj::Rc<kj::Refcounted>_> *inner)

{
  PromiseArenaMember *node;
  void *continuationTracePtr;
  PromiseArenaMember *local_50;
  anon_class_8_1_a7efefcd_for_errorHandler local_48;
  anon_class_8_1_a7efefcd_for_func local_40;
  SourceLocation local_38;
  
  AdapterBase::AdapterBase(&this->super_AdapterBase,canceler);
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_006cf3c8;
  this->fulfiller = fulfiller;
  local_38.fileName =
       (char *)kj::_::
               TransformPromiseNode<kj::Rc<kj::Refcounted>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h:916:15),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h:917:15)>
               ::anon_class_8_1_a7efefcd_for_func::operator();
  local_48.fulfiller = fulfiller;
  local_40.fulfiller = fulfiller;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::TransformPromiseNode<kj::Rc<kj::Refcounted>,kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>>::AdapterImpl(kj::PromiseFulfiller<kj::Rc<kj::Refcounted>>&,kj::Canceler&,kj::Promise<kj::Rc<kj::Refcounted>>)::_lambda(kj::Rc<kj::Refcounted>&&)_1_,kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>>::Promise(kj::PromiseFulfiller<kj::Rc<kj::Refcounted>>&,kj::Canceler&,kj::Promise<kj::Rc<kj::Refcounted>>)::_lambda(kj::Exception&&)_1_>,kj::_::PromiseDisposer,kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>>::AdapterImpl(kj::PromiseFulfiller<kj::Rc<kj::Refcounted>>&,kj::Canceler&,kj::Promise<kj::Rc<kj::Refcounted>>)::_lambda(kj::Rc<kj::Refcounted>&&)_1_,kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>>::Promise(kj::PromiseFulfiller<kj::Rc<kj::Refcounted>>&,kj::Canceler&,kj::Promise<kj::Rc<kj::Refcounted>>)::_lambda(kj::Exception&&)_1_,void*&>
            ((PromiseDisposer *)&local_50,(OwnPromiseNode *)inner,&local_40,&local_48,
             &local_38.fileName);
  local_38.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h";
  local_38.function = "AdapterImpl";
  local_38.lineNumber = 0x393;
  local_38.columnNumber = 0x11;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&this->inner,(OwnPromiseNode *)&local_50,&local_38);
  node = local_50;
  if (local_50 != (PromiseArenaMember *)0x0) {
    local_50 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  return;
}

Assistant:

AdapterImpl(PromiseFulfiller<T>& fulfiller,
                Canceler& canceler, Promise<T> inner)
        : AdapterBase(canceler),
          fulfiller(fulfiller),
          inner(inner.then(
              [&fulfiller](T&& value) { fulfiller.fulfill(kj::mv(value)); },
              [&fulfiller](Exception&& e) { fulfiller.reject(kj::mv(e)); })
              .eagerlyEvaluate(nullptr)) {}